

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O0

void elt_mul(u8 *d,u8 *a,u8 *b)

{
  byte local_29;
  uint local_28;
  uint uStack_24;
  u8 mask;
  u32 n;
  u32 i;
  u8 *b_local;
  u8 *a_local;
  u8 *d_local;
  
  elt_zero(d);
  uStack_24 = 0;
  local_29 = 1;
  for (local_28 = 0; local_28 < 0xe9; local_28 = local_28 + 1) {
    elt_mul_x(d,d);
    if ((a[uStack_24] & local_29) != 0) {
      elt_add(d,d,b);
    }
    local_29 = (byte)((int)(uint)local_29 >> 1);
    if (local_29 == 0) {
      local_29 = 0x80;
      uStack_24 = uStack_24 + 1;
    }
  }
  return;
}

Assistant:

static void elt_mul(u8 *d, u8 *a, u8 *b)
{
	u32 i, n;
	u8 mask;

	elt_zero(d);

	i = 0;
	mask = 1;
	for (n = 0; n < 233; n++) {
		elt_mul_x(d, d);

		if ((a[i] & mask) != 0)
			elt_add(d, d, b);

		mask >>= 1;
		if (mask == 0) {
			mask = 0x80;
			i++;
		}
	}
}